

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandGraft(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Wlc_Ntk_t *pWVar2;
  char *pcVar3;
  uint fVerbose;
  
  pWVar2 = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  fVerbose = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"vh");
    if (iVar1 != 0x76) break;
    fVerbose = fVerbose ^ 1;
  }
  if (iVar1 == -1) {
    if (pWVar2 == (Wlc_Ntk_t *)0x0) {
      iVar1 = 0;
      Abc_Print(1,"Abc_CommandGraft(): There is no current design.\n");
    }
    else {
      pWVar2 = Wlc_NtkGraftMulti(pWVar2,fVerbose);
      if ((Wlc_Ntk_t *)pAbc->pAbcWlc != (Wlc_Ntk_t *)0x0) {
        Wlc_NtkFree((Wlc_Ntk_t *)pAbc->pAbcWlc);
      }
      pAbc->pAbcWlc = pWVar2;
      iVar1 = 0;
    }
  }
  else {
    Abc_Print(-2,"usage: %%graft [-vh]\n");
    Abc_Print(-2,"\t         detects multipliers in LHS of the miter and moves them to RHS\n");
    pcVar3 = "yes";
    if (fVerbose == 0) {
      pcVar3 = "no";
    }
    Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
    Abc_Print(-2,"\t-h     : print the command usage\n");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int Abc_CommandGraft( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Wlc_Ntk_t * Wlc_NtkGraftMulti( Wlc_Ntk_t * p, int fVerbose );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    int c, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandGraft(): There is no current design.\n" );
        return 0;
    }
    pNtk = Wlc_NtkGraftMulti( pNtk, fVerbose );
    Wlc_AbcUpdateNtk( pAbc, pNtk );
    return 0;
usage:
    Abc_Print( -2, "usage: %%graft [-vh]\n" );
    Abc_Print( -2, "\t         detects multipliers in LHS of the miter and moves them to RHS\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}